

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

void __thiscall QString::resize(QString *this,qsizetype size)

{
  Data *pDVar1;
  bool bVar2;
  qsizetype newSize;
  
  newSize = 0;
  if (0 < size) {
    newSize = size;
  }
  pDVar1 = (this->d).d;
  if ((pDVar1 != (Data *)0x0) &&
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    bVar2 = needsReallocate(this,newSize);
    if (!bVar2) goto LAB_0011acab;
  }
  reallocData(this,newSize,Grow);
LAB_0011acab:
  (this->d).size = newSize;
  pDVar1 = (this->d).d;
  if ((pDVar1 != (Data *)0x0) && ((pDVar1->super_QArrayData).alloc != 0)) {
    (this->d).ptr[newSize] = L'\0';
  }
  return;
}

Assistant:

void QString::resize(qsizetype size)
{
    if (size < 0)
        size = 0;

    if (d->needsDetach() || needsReallocate(*this, size))
        reallocData(size, QArrayData::Grow);
    d.size = size;
    if (d->allocatedCapacity())
        d.data()[size] = u'\0';
}